

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

ssize_t __thiscall QMakeProject::read(QMakeProject *this,int __fd,void *__buf,size_t __nbytes)

{
  QLatin1StringView latin1;
  bool bVar1;
  undefined4 in_register_00000034;
  QString *pQVar2;
  long in_FS_OFFSET;
  QString absproj;
  QString *in_stack_ffffffffffffff08;
  QMakeEvaluator *in_stack_ffffffffffffff10;
  QString *this_00;
  QString *in_stack_ffffffffffffff18;
  QFileInfo *this_01;
  QLatin1String *in_stack_ffffffffffffff20;
  undefined5 in_stack_ffffffffffffff40;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  EvalFileType type;
  undefined4 in_stack_ffffffffffffff58;
  QMakeEvaluator *in_stack_ffffffffffffff60;
  QString local_98;
  undefined1 local_80 [24];
  QDir local_68 [8];
  undefined1 local_60 [56];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  long lVar6;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = SUB84(__buf,0);
  QString::operator=(&this->m_projectFile,pQVar2);
  type = (EvalFileType)((ulong)this >> 0x20);
  QMakeEvaluator::setOutputDir(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  bVar1 = ::operator==(in_stack_ffffffffffffff18,(QLatin1StringView *)in_stack_ffffffffffffff10);
  bVar5 = 0;
  bVar4 = 0;
  bVar3 = 0;
  if (bVar1) {
    QLatin1String::QLatin1String(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    latin1.m_size._5_1_ = bVar3;
    latin1.m_size._0_5_ = in_stack_ffffffffffffff40;
    latin1.m_size._6_1_ = bVar4;
    latin1.m_size._7_1_ = bVar5;
    latin1.m_data = (char *)pQVar2;
    QString::QString((QString *)in_stack_ffffffffffffff20,latin1);
  }
  else {
    qmake_getpwd();
    bVar5 = 1;
    QDir::QDir(local_68,(QString *)local_80);
    bVar4 = 1;
    QDir::absoluteFilePath((QString *)local_60);
    bVar3 = 1;
    QDir::cleanPath((QString *)&local_28);
  }
  if ((bVar3 & 1) != 0) {
    QString::~QString((QString *)0x32cbde);
  }
  if ((bVar4 & 1) != 0) {
    QDir::~QDir(local_68);
  }
  if ((bVar5 & 1) != 0) {
    QString::~QString((QString *)0x32cc07);
  }
  this_01 = (QFileInfo *)&stack0xffffffffffffff60;
  QFileInfo::QFileInfo(this_01,(QString *)&local_28);
  this_00 = &local_98;
  QFileInfo::path();
  QString::operator=(this_00,in_stack_ffffffffffffff08);
  QString::~QString((QString *)0x32cc57);
  QFileInfo::~QFileInfo(this_01);
  QMakeEvaluator::evaluateFile
            (in_stack_ffffffffffffff60,(QString *)CONCAT44(local_c,in_stack_ffffffffffffff58),type,
             (QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>)SUB84((ulong)lVar6 >> 0x20,0));
  bVar1 = boolRet(ReturnFalse);
  QString::~QString((QString *)0x32cc96);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar1);
}

Assistant:

bool QMakeProject::read(const QString &project, LoadFlags what)
{
    m_projectFile = project;
    setOutputDir(Option::output_dir);
    QString absproj = (project == QLatin1String("-"))
            ? QLatin1String("(stdin)")
            : QDir::cleanPath(QDir(qmake_getpwd()).absoluteFilePath(project));
    m_projectDir = QFileInfo(absproj).path();
    return boolRet(evaluateFile(absproj, QMakeHandler::EvalProjectFile, what));
}